

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderTextureSizeTests::init
          (ShaderTextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType TVar1;
  Context *pCVar2;
  undefined8 *puVar3;
  long *plVar4;
  TestNode *node;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  string desc;
  string name;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  undefined8 uStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  int local_24c;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  long local_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  TestNode *local_1e0;
  SamplerType *local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = 0;
  local_1e0 = (TestNode *)this;
  do {
    local_1d8 = init::samplerTypes + local_1b0;
    local_208 = 0;
    do {
      local_240 = 0;
      local_238 = local_238 & 0xffffffffffffff00;
      local_248 = &local_238;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
      puVar5 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar5) {
        local_280 = *puVar5;
        uStack_278 = puVar3[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *puVar5;
        local_290 = (ulong *)*puVar3;
      }
      local_288 = puVar3[1];
      *puVar3 = puVar5;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      local_24c = *(int *)((long)init::sampleCounts + local_208);
      std::ostream::operator<<(local_1a8,local_24c);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar7 = 0xf;
      if (local_290 != &local_280) {
        uVar7 = local_280;
      }
      if (uVar7 < (ulong)(local_220 + local_288)) {
        uVar7 = 0xf;
        if (local_228 != &local_218) {
          uVar7 = CONCAT71(uStack_217,local_218);
        }
        if (uVar7 < (ulong)(local_220 + local_288)) goto LAB_014eb813;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_290);
      }
      else {
LAB_014eb813:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_228);
      }
      local_2b0 = &local_2a0;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_2a0 = *plVar4;
        lStack_298 = puVar3[3];
      }
      else {
        local_2a0 = *plVar4;
        local_2b0 = (long *)*puVar3;
      }
      local_2a8 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_270 = &local_260;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_260 = *plVar6;
        lStack_258 = plVar4[3];
      }
      else {
        local_260 = *plVar6;
        local_270 = (long *)*plVar4;
      }
      local_268 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_1c0 = *plVar6;
        lStack_1b8 = plVar4[3];
        local_1d0 = &local_1c0;
      }
      else {
        local_1c0 = *plVar6;
        local_1d0 = (long *)*plVar4;
      }
      local_1c8 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      local_220 = 0;
      local_218 = 0;
      local_228 = &local_218;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
      puVar5 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar5) {
        local_238 = *puVar5;
        lStack_230 = plVar4[3];
        local_248 = &local_238;
      }
      else {
        local_238 = *puVar5;
        local_248 = (ulong *)*plVar4;
      }
      local_240 = plVar4[1];
      *plVar4 = (long)puVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,local_24c);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar7 = 0xf;
      if (local_248 != &local_238) {
        uVar7 = local_238;
      }
      if (uVar7 < (ulong)(local_1f8 + local_240)) {
        uVar7 = 0xf;
        if (local_200 != local_1f0) {
          uVar7 = local_1f0[0];
        }
        if (uVar7 < (ulong)(local_1f8 + local_240)) goto LAB_014ebace;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_248);
      }
      else {
LAB_014ebace:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_200);
      }
      puVar5 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar5) {
        local_280 = *puVar5;
        uStack_278 = puVar3[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *puVar5;
        local_290 = (ulong *)*puVar3;
      }
      local_288 = puVar3[1];
      *puVar3 = puVar5;
      puVar3[1] = 0;
      *(undefined1 *)puVar5 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
      local_2b0 = &local_2a0;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_2a0 = *plVar6;
        lStack_298 = plVar4[3];
      }
      else {
        local_2a0 = *plVar6;
        local_2b0 = (long *)*plVar4;
      }
      local_2a8 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_270 = &local_260;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_260 = *plVar6;
        lStack_258 = plVar4[3];
      }
      else {
        local_260 = *plVar6;
        local_270 = (long *)*plVar4;
      }
      local_268 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      }
      node = (TestNode *)operator_new(0xb8);
      pCVar2 = (Context *)local_1e0[1]._vptr_TestNode;
      TVar1 = local_1d8->type;
      tcu::TestCase::TestCase
                ((TestCase *)node,pCVar2->m_testCtx,(char *)local_1d0,(char *)local_270);
      node[1]._vptr_TestNode = (_func_int **)pCVar2;
      node->_vptr_TestNode = (_func_int **)&PTR__TextureSizeCase_021ac038;
      *(TextureType *)&node[1].m_testCtx = TVar1;
      *(int *)((long)&node[1].m_testCtx + 4) = local_24c;
      *(bool *)&node[1].m_name._M_dataplus._M_p =
           (TVar1 | TEXTURE_INT_2D) == TEXTURE_INT_2D_ARRAY || TVar1 == TEXTURE_UINT_2D_ARRAY;
      *(undefined8 *)((long)&node[1].m_name._M_dataplus._M_p + 4) = 0;
      node[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&node[1].m_name.field_2 + 8) = 0;
      node[1].m_description._M_dataplus._M_p = (pointer)0x0;
      node[1].m_description._M_string_length = 0;
      *(undefined4 *)&node[1].m_description.field_2 = 0;
      *(undefined2 *)((long)&node[1].m_description.field_2 + 4) = 0x101;
      tcu::TestNode::addChild(local_1e0,node);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      local_208 = local_208 + 4;
    } while (local_208 == 4);
    local_1b0 = local_1b0 + 1;
    if (local_1b0 == 6) {
      return 6;
    }
  } while( true );
}

Assistant:

void ShaderTextureSizeTests::init (void)
{
	static const struct SamplerType
	{
		TextureSizeCase::TextureType	type;
		const char*						name;
	} samplerTypes[] =
	{
		{ TextureSizeCase::TEXTURE_FLOAT_2D,		"texture_2d"			},
		{ TextureSizeCase::TEXTURE_FLOAT_2D_ARRAY,	"texture_2d_array"		},
		{ TextureSizeCase::TEXTURE_INT_2D,			"texture_int_2d"		},
		{ TextureSizeCase::TEXTURE_INT_2D_ARRAY,	"texture_int_2d_array"	},
		{ TextureSizeCase::TEXTURE_UINT_2D,			"texture_uint_2d"		},
		{ TextureSizeCase::TEXTURE_UINT_2D_ARRAY,	"texture_uint_2d_array"	},
	};

	static const int sampleCounts[] = { 1, 4 };

	for (int samplerTypeNdx = 0; samplerTypeNdx < DE_LENGTH_OF_ARRAY(samplerTypes); ++samplerTypeNdx)
	{
		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleCountNdx)
		{
			const std::string name = std::string() + "samples_" + de::toString(sampleCounts[sampleCountNdx]) + "_" + samplerTypes[samplerTypeNdx].name;
			const std::string desc = std::string() + "samples count = " + de::toString(sampleCounts[sampleCountNdx]) + ", type = " + samplerTypes[samplerTypeNdx].name;

			addChild(new TextureSizeCase(m_context, name.c_str(), desc.c_str(), samplerTypes[samplerTypeNdx].type, sampleCounts[sampleCountNdx]));
		}
	}
}